

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogoutView.cpp
# Opt level: O3

void __thiscall LogoutView::display(LogoutView *this)

{
  Application *this_00;
  Controller *this_01;
  View *pVVar1;
  string local_38;
  
  this_00 = Application::getInstance();
  Application::logout(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Logged out successfully.\n",0x19);
  this_01 = Controller::getInstance();
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"splash","");
  pVVar1 = Controller::getView(this_01,&local_38);
  View::response->view = pVVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LogoutView::display() {
    Application::getInstance().logout();
    cout << "Logged out successfully.\n";
    // Application::saveData();
    response->view = Controller::getInstance().getView("splash");
}